

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numGuess.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  int local_38;
  int remainingGuesses;
  int guess;
  int i;
  int closestGuess;
  int iStack_24;
  bool numGuessed;
  int upperBound;
  int lowerBound;
  int magicNumber;
  undefined4 uStack_14;
  char playAgain;
  int MAX_NUMBER;
  int MIN_NUMBER;
  int NUM_GUESSES;
  
  MIN_NUMBER = 0;
  MAX_NUMBER = 3;
  uStack_14 = 1;
  magicNumber = 100;
  lowerBound._3_1_ = 'n';
  do {
    upperBound = 0;
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Welcome to the number guessing game!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 1: Please enter an integer between ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3," and ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
    poVar3 = std::operator<<(poVar3," (inclusive).");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Floats will always be rounded down.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    while (bVar1 = outOfBounds(upperBound,1,100), bVar1) {
      std::operator<<((ostream *)&std::cout,"Number please: ");
      std::istream::operator>>((istream *)&std::cin,&upperBound);
      bVar1 = outOfBounds(upperBound,1,100);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Number is out of bounds. Please try again");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    iStack_24 = 1;
    closestGuess = 100;
    i._3_1_ = 0;
    guess = -1;
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Player 2: Please guess the number that player 1 chose.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (remainingGuesses = 0; remainingGuesses < 3; remainingGuesses = remainingGuesses + 1) {
      local_38 = 0;
      iVar2 = 3 - remainingGuesses;
      poVar3 = std::operator<<((ostream *)&std::cout,"You have ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3," guesses remaining.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Please choose a number between ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iStack_24);
      poVar3 = std::operator<<(poVar3," and ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,closestGuess);
      std::operator<<(poVar3,".\n");
      while (bVar1 = outOfBounds(local_38,iStack_24,closestGuess), bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iStack_24);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,closestGuess);
        std::operator<<(poVar3,"): ");
        std::istream::operator>>((istream *)&std::cin,&local_38);
        bVar1 = outOfBounds(local_38,iStack_24,closestGuess);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Number is out of bounds. Please try again"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      if (local_38 < upperBound) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Your guess was too low!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iStack_24 = local_38 + 1;
        if (guess == -1) {
          guess = local_38;
        }
        else {
          iVar2 = upperBound - guess;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          iVar4 = upperBound - local_38;
          if (iVar4 < 1) {
            iVar4 = -iVar4;
          }
          if (iVar4 < iVar2) {
            guess = local_38;
          }
        }
      }
      else {
        if (local_38 <= upperBound) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Congrats! You won!");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          i._3_1_ = 1;
          break;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Your guess was too high!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        closestGuess = local_38 + -1;
        if (guess == -1) {
          guess = local_38;
        }
        else {
          iVar2 = upperBound - guess;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          iVar4 = upperBound - local_38;
          if (iVar4 < 1) {
            iVar4 = -iVar4;
          }
          if (iVar4 < iVar2) {
            guess = local_38;
          }
        }
      }
    }
    if ((i._3_1_ & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Player 2 lost. Player 1 had number ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,upperBound);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Player 2\'s closest guess was ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,guess);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)&std::cout,"Enter \'y\' to play again: ");
    std::operator>>((istream *)&std::cin,(char *)((long)&lowerBound + 3));
    iVar2 = tolower((int)lowerBound._3_1_);
    if (iVar2 != 0x79) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    const int NUM_GUESSES = 3;
    const int MIN_NUMBER = 1;
    const int MAX_NUMBER = 100;

    char playAgain = 'n';

    do
    {
        int magicNumber = MIN_NUMBER - 1;

        cout << endl << "Welcome to the number guessing game!" << endl;
        cout << endl;
        cout << "Player 1: Please enter an integer between " << MIN_NUMBER <<
                " and " << MAX_NUMBER << " (inclusive)." << endl;
        cout << "Floats will always be rounded down." << endl;

        while(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
        {

            cout << "Number please: ";
            cin >> magicNumber;

            if(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
            {
                cout << "Number is out of bounds. Please try again" << endl;
            }
        }

        // Guessing section
        int lowerBound = MIN_NUMBER;
        int upperBound = MAX_NUMBER;
        bool numGuessed = false;
        int closestGuess = -1;

        cout << "Player 2: Please guess the number that player 1 chose." << endl;

        for (int i = 0; i < NUM_GUESSES; i++)
        {

            int guess = MIN_NUMBER - 1;
            int remainingGuesses = NUM_GUESSES - i;


            cout << "You have " << remainingGuesses << " guesses remaining." << endl;
            cout << "Please choose a number between " << lowerBound << " and " << upperBound << ".\n";

            while(outOfBounds(guess, lowerBound, upperBound))
            {
                cout << "(" << lowerBound << " - " << upperBound << "): ";
                cin >> guess;

                if(outOfBounds(guess, lowerBound, upperBound))
                {
                    cout << "Number is out of bounds. Please try again" << endl;
                }
            }

            if(guess < magicNumber)
            {
                cout << "Your guess was too low!" << endl;
                lowerBound = guess + 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else if(guess > magicNumber)
            {
                cout << "Your guess was too high!" << endl;
                upperBound = guess - 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else
            {
                cout << "Congrats! You won!" << endl;
                numGuessed = true;
                break;
            }
        }

        if(!numGuessed)
        {
            cout << "Player 2 lost. Player 1 had number " << magicNumber << endl;
            cout << "Player 2's closest guess was " << closestGuess << endl;
        }

        cout << "Enter 'y' to play again: ";
        cin >> playAgain;

    } while (tolower(playAgain) == 'y');

    return 0;
}